

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion * quaternion_subtract(quaternion *self,quaternion *qT)

{
  float fVar1;
  
  fVar1 = (self->field_0).q[1];
  (self->field_0).q[0] = (self->field_0).q[0] - (qT->field_0).q[0];
  (self->field_0).q[1] = fVar1 - (qT->field_0).q[1];
  (self->field_0).q[2] = (self->field_0).q[2] - (qT->field_0).q[2];
  (self->field_0).q[3] = (self->field_0).q[3] - (qT->field_0).q[3];
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_subtract(struct quaternion *self, const struct quaternion *qT)
{
	self->x -= qT->x;
	self->y -= qT->y;
	self->z -= qT->z;
	self->w -= qT->w;

	return self;
}